

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_dense.cpp
# Opt level: O0

void __thiscall
test_matrix_dense_scalar_matrix_division_assignment_Test::
test_matrix_dense_scalar_matrix_division_assignment_Test
          (test_matrix_dense_scalar_matrix_division_assignment_Test *this)

{
  test_matrix_dense_scalar_matrix_division_assignment_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__test_matrix_dense_scalar_matrix_division_assignment_Test_001eda50;
  return;
}

Assistant:

TEST(test_matrix_dense, scalar_matrix_division_assignment) {
  Matrix_Dense<Scalar, 0, 0> dynamic_matrix = {{1, 2, 3}, {4, 5, 6}, {7, 8, 9}};
  Matrix_Dense<Scalar, 3, 3> static_matrix = {{10, 20, 30}, {40, 50, 60}, {70, 80, 90}};

  static_matrix /= -10.0;
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[0][0], static_matrix[0][0]);
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[0][1], static_matrix[0][1]);
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[0][2], static_matrix[0][2]);
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[1][0], static_matrix[1][0]);
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[1][1], static_matrix[1][1]);
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[1][2], static_matrix[1][2]);
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[2][0], static_matrix[2][0]);
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[2][1], static_matrix[2][1]);
  EXPECT_DOUBLE_EQ(-1.0 * dynamic_matrix[2][2], static_matrix[2][2]);

  dynamic_matrix /= 0.1;
  EXPECT_DOUBLE_EQ(dynamic_matrix[0][0], -10.0 * static_matrix[0][0]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[0][1], -10.0 * static_matrix[0][1]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[0][2], -10.0 * static_matrix[0][2]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[1][0], -10.0 * static_matrix[1][0]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[1][1], -10.0 * static_matrix[1][1]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[1][2], -10.0 * static_matrix[1][2]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[2][0], -10.0 * static_matrix[2][0]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[2][1], -10.0 * static_matrix[2][1]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[2][2], -10.0 * static_matrix[2][2]);
}